

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O0

uint8_t * __thiscall
CoreML::Specification::TreeEnsembleParameters_TreeNode_EvaluationInfo::_InternalSerialize
          (TreeEnsembleParameters_TreeNode_EvaluationInfo *this,uint8_t *target,
          EpsCopyOutputStream *stream)

{
  bool bVar1;
  int size;
  uint64_t uVar2;
  uint8_t *puVar3;
  void *data;
  double dVar4;
  uint64_t raw_evaluationvalue;
  double tmp_evaluationvalue;
  uint32_t cached_has_bits;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  TreeEnsembleParameters_TreeNode_EvaluationInfo *this_local;
  
  uVar2 = _internal_evaluationindex(this);
  stream_local = (EpsCopyOutputStream *)target;
  if (uVar2 != 0) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    uVar2 = _internal_evaluationindex(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteUInt64ToArray(1,uVar2,puVar3);
  }
  dVar4 = _internal_evaluationvalue(this);
  if (dVar4 != 0.0) {
    puVar3 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    dVar4 = _internal_evaluationvalue(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteDoubleToArray(2,dVar4,puVar3);
  }
  bVar1 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_MessageLite)._internal_metadata_);
  if (bVar1) {
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    data = (void *)std::__cxx11::string::data();
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    size = std::__cxx11::string::size();
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteRaw
                             (stream,data,size,(uint8_t *)stream_local);
  }
  return (uint8_t *)stream_local;
}

Assistant:

uint8_t* TreeEnsembleParameters_TreeNode_EvaluationInfo::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.TreeEnsembleParameters.TreeNode.EvaluationInfo)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // uint64 evaluationIndex = 1;
  if (this->_internal_evaluationindex() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteUInt64ToArray(1, this->_internal_evaluationindex(), target);
  }

  // double evaluationValue = 2;
  static_assert(sizeof(uint64_t) == sizeof(double), "Code assumes uint64_t and double are the same size.");
  double tmp_evaluationvalue = this->_internal_evaluationvalue();
  uint64_t raw_evaluationvalue;
  memcpy(&raw_evaluationvalue, &tmp_evaluationvalue, sizeof(tmp_evaluationvalue));
  if (raw_evaluationvalue != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteDoubleToArray(2, this->_internal_evaluationvalue(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.TreeEnsembleParameters.TreeNode.EvaluationInfo)
  return target;
}